

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O0

FrameOpResult __thiscall
QRhiGles2::beginOffscreenFrame(QRhiGles2 *this,QRhiCommandBuffer **cb,BeginFrameFlags param_3)

{
  bool bVar1;
  QSurface *in_RSI;
  QRhiGles2 *in_RDI;
  GLuint in_stack_ffffffffffffffd8;
  Flag in_stack_ffffffffffffffdc;
  QRhiGles2 *this_00;
  FrameOpResult local_4;
  
  this_00 = in_RDI;
  bVar1 = ensureContext(in_RDI,in_RSI);
  if (bVar1) {
    (in_RDI->ofr).active = true;
    executeDeferredReleases(this_00);
    QGles2CommandBuffer::resetState((QGles2CommandBuffer *)in_RDI);
    bVar1 = QFlags<QRhi::Flag>::testFlag((QFlags<QRhi::Flag> *)in_RDI,in_stack_ffffffffffffffdc);
    if (((bVar1) && ((*(ushort *)&(in_RDI->caps).field_0x3c >> 6 & 1) != 0)) &&
       ((in_RDI->ofr).tsQueries[0] == 0)) {
      QOpenGLExtraFunctions::glGenQueries
                ((QOpenGLExtraFunctions *)this_00,(GLsizei)((ulong)in_RSI >> 0x20),(GLuint *)in_RDI)
      ;
    }
    addBoundaryCommand((QGles2CommandBuffer *)in_RDI,in_stack_ffffffffffffffdc,
                       in_stack_ffffffffffffffd8);
    in_RSI->_vptr_QSurface = (_func_int **)&(in_RDI->ofr).cbWrapper;
    local_4 = FrameOpSuccess;
  }
  else {
    local_4 = FrameOpError;
    if ((in_RDI->contextLost & 1U) != 0) {
      local_4 = FrameOpDeviceLost;
    }
  }
  return local_4;
}

Assistant:

QRhi::FrameOpResult QRhiGles2::beginOffscreenFrame(QRhiCommandBuffer **cb, QRhi::BeginFrameFlags)
{
    if (!ensureContext())
        return contextLost ? QRhi::FrameOpDeviceLost : QRhi::FrameOpError;

    ofr.active = true;

    executeDeferredReleases();
    ofr.cbWrapper.resetState();

    if (rhiFlags.testFlag(QRhi::EnableTimestamps) && caps.timestamps) {
        if (!ofr.tsQueries[0])
            f->glGenQueries(2, ofr.tsQueries);
    }

    addBoundaryCommand(&ofr.cbWrapper, QGles2CommandBuffer::Command::BeginFrame, ofr.tsQueries[0]);
    *cb = &ofr.cbWrapper;

    return QRhi::FrameOpSuccess;
}